

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O1

int_t mc64ed_(int_t *qlen,int_t *n,int_t *q,double *d__,int_t *l,int_t *iway)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  
  iVar2 = q[(long)*qlen + -1];
  dVar1 = d__[(long)iVar2 + -1];
  *qlen = *qlen + -1;
  iVar4 = *n;
  if (*iway == 1) {
    if (0 < iVar4) {
      uVar6 = 1;
      do {
        uVar5 = uVar6 * 2;
        if (*qlen < (int)uVar5) break;
        dVar7 = d__[(long)q[(long)(int)uVar5 + -1] + -1];
        if ((int)uVar5 < *qlen) {
          if (dVar7 < d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1]) {
            dVar7 = d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1];
            uVar5 = uVar5 | 1;
          }
        }
        if (dVar7 <= dVar1) break;
        iVar3 = q[(long)(int)uVar5 + -1];
        q[(long)(int)uVar6 + -1] = iVar3;
        l[(long)iVar3 + -1] = uVar6;
        iVar4 = iVar4 + -1;
        uVar6 = uVar5;
      } while (iVar4 != 0);
      goto LAB_00113e7c;
    }
  }
  else if (0 < iVar4) {
    uVar6 = 1;
    do {
      uVar5 = uVar6 * 2;
      if (*qlen < (int)uVar5) break;
      dVar7 = d__[(long)q[(long)(int)uVar5 + -1] + -1];
      if ((int)uVar5 < *qlen) {
        if (d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1] < dVar7) {
          dVar7 = d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1];
          uVar5 = uVar5 | 1;
        }
      }
      if (dVar1 <= dVar7) break;
      iVar3 = q[(long)(int)uVar5 + -1];
      q[(long)(int)uVar6 + -1] = iVar3;
      l[(long)iVar3 + -1] = uVar6;
      iVar4 = iVar4 + -1;
      uVar6 = uVar5;
    } while (iVar4 != 0);
    goto LAB_00113e7c;
  }
  uVar6 = 1;
LAB_00113e7c:
  q[(long)(int)uVar6 + -1] = iVar2;
  l[(long)iVar2 + -1] = uVar6;
  return 0;
}

Assistant:

int_t mc64ed_(int_t *qlen, int_t *n, int_t *q, 
	double *d__, int_t *l, int_t *iway)
{
    /* System generated locals */
    int_t i__1;

    /* Local variables */
    int_t i__;
    double di, dk, dr;
    int_t pos, idum, posk;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* Variables QLEN,N,Q,D,L are described in MC64B/BD (IWAY = 1) or */
/*     MC64W/WD (IWAY = 2) */
/* The root node is deleted from the binary heap. */
/* Local variables and parameters */
/* Move last element to begin of Q */
    /* Parameter adjustments */
    --l;
    --d__;
    --q;

    /* Function Body */
    i__ = q[*qlen];
    di = d__[i__];
    --(*qlen);
    pos = 1;
    if (*iway == 1) {
	i__1 = *n;
	for (idum = 1; idum <= i__1; ++idum) {
	    posk = pos << 1;
	    if (posk > *qlen) {
		goto L20;
	    }
	    dk = d__[q[posk]];
	    if (posk < *qlen) {
		dr = d__[q[posk + 1]];
		if (dk < dr) {
		    ++posk;
		    dk = dr;
		}
	    }
	    if (di >= dk) {
		goto L20;
	    }
/* Exchange old last element with larger priority child */
	    q[pos] = q[posk];
	    l[q[pos]] = pos;
	    pos = posk;
/* L10: */
	}
/* End of dummy loop; this point is never reached */
    } else {
	i__1 = *n;
	for (idum = 1; idum <= i__1; ++idum) {
	    posk = pos << 1;
	    if (posk > *qlen) {
		goto L20;
	    }
	    dk = d__[q[posk]];
	    if (posk < *qlen) {
		dr = d__[q[posk + 1]];
		if (dk > dr) {
		    ++posk;
		    dk = dr;
		}
	    }
	    if (di <= dk) {
		goto L20;
	    }
/* Exchange old last element with smaller child */
	    q[pos] = q[posk];
	    l[q[pos]] = pos;
	    pos = posk;
/* L15: */
	}
/* End of dummy loop; this point is never reached */
    }
/* End of dummy if; this point is never reached */
L20:
    q[pos] = i__;
    l[i__] = pos;
    return 0;
}